

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O2

int64_t aom_sse_avx2(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int64_t iVar5;
  uint8_t *puVar6;
  int i;
  long lVar7;
  undefined4 in_register_00000034;
  uint uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  int iVar11;
  int a_stride_00;
  undefined1 auVar12 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  __m256i local_a0;
  undefined8 local_80;
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  local_a0 = auVar12._0_32_;
  if (width == 4) {
    iVar11 = 0;
    do {
      sse_w4x4_avx2(a,a_stride,b,b_stride,&local_a0);
      a = a + a_stride * 4;
      b = b + b_stride * 4;
      iVar11 = iVar11 + 4;
    } while (iVar11 < height);
  }
  else if (width == 8) {
    iVar11 = 0;
    do {
      sse_w8x2_avx2(a,a_stride,b,b_stride,&local_a0);
      a = a + a_stride * 2;
      b = b + b_stride * 2;
      iVar11 = iVar11 + 2;
    } while (iVar11 < height);
  }
  else if (width == 0x10) {
    iVar11 = 0;
    do {
      auVar14._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])a + a_stride) +
           ZEXT116(1) * *(undefined1 (*) [16])a;
      auVar14._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])a + a_stride);
      auVar15._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])b + b_stride) +
           ZEXT116(1) * *(undefined1 (*) [16])b;
      auVar15._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])b + b_stride);
      auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar3 = vpunpcklbw_avx2(auVar14,auVar13);
      auVar14 = vpunpckhbw_avx2(auVar14,auVar13);
      auVar4 = vpunpcklbw_avx2(auVar15,auVar13);
      auVar3 = vpsubw_avx2(auVar3,auVar4);
      auVar4 = vpunpckhbw_avx2(auVar15,auVar13);
      auVar14 = vpsubw_avx2(auVar14,auVar4);
      auVar3 = vpmaddwd_avx2(auVar3,auVar3);
      auVar14 = vpmaddwd_avx2(auVar14,auVar14);
      auVar3 = vpaddd_avx2(auVar14,auVar3);
      local_a0 = (__m256i)vpaddd_avx2(auVar3,auVar12._0_32_);
      auVar12 = ZEXT3264((undefined1  [32])local_a0);
      a = *(undefined1 (*) [16])a + a_stride * 2;
      b = *(undefined1 (*) [16])b + b_stride * 2;
      iVar11 = iVar11 + 2;
    } while (iVar11 < height);
  }
  else if (width == 0x20) {
    iVar11 = 0;
    do {
      sse_w32_avx2(&local_a0,a,b);
      a = a + a_stride;
      b = b + b_stride;
      iVar11 = iVar11 + 1;
    } while (iVar11 < height);
  }
  else if (width == 0x40) {
    iVar11 = 0;
    do {
      sse_w32_avx2(&local_a0,a,b);
      sse_w32_avx2(&local_a0,a + 0x20,b + 0x20);
      a = a + a_stride;
      b = b + b_stride;
      iVar11 = iVar11 + 1;
    } while (iVar11 < height);
  }
  else if (width == 0x80) {
    puVar10 = b + 0x60;
    iVar11 = 0;
    do {
      sse_w32_avx2(&local_a0,a,puVar10 + -0x60);
      sse_w32_avx2(&local_a0,a + 0x20,puVar10 + -0x40);
      sse_w32_avx2(&local_a0,a + 0x40,puVar10 + -0x20);
      sse_w32_avx2(&local_a0,a + 0x60,puVar10);
      a = a + a_stride;
      iVar11 = iVar11 + 1;
      puVar10 = puVar10 + b_stride;
    } while (iVar11 < height);
  }
  else if ((width & 7U) == 0) {
    iVar11 = 0;
    do {
      lVar7 = 0;
      do {
        sse_w8x2_avx2(a + lVar7,a_stride,b + lVar7,b_stride,&local_a0);
        lVar7 = lVar7 + 8;
      } while (lVar7 < width);
      a = a + a_stride * 2;
      b = b + b_stride * 2;
      iVar11 = iVar11 + 2;
    } while (iVar11 < height);
  }
  else {
    local_68 = (long)(a_stride * 4);
    local_70 = (long)(b_stride * 4);
    puVar6 = b + b_stride * 2;
    puVar10 = a + a_stride * 2;
    uVar9 = 0;
    local_80 = CONCAT44(in_register_00000034,a_stride);
    local_78 = (ulong)(uint)b_stride;
    do {
      lVar7 = 0;
      local_60 = uVar9;
      do {
        a_stride_00 = (int)local_80;
        iVar11 = (int)local_78;
        sse_w8x2_avx2(a + lVar7,a_stride_00,b + lVar7,iVar11,&local_a0);
        sse_w8x2_avx2(puVar10 + lVar7,a_stride_00,puVar6 + lVar7,iVar11,&local_a0);
        lVar1 = lVar7 + 8;
        bVar2 = lVar7 < (long)width + -0xc;
        lVar7 = lVar1;
      } while (bVar2);
      sse_w4x4_avx2(a + lVar1,(int)local_80,b + lVar1,(int)local_78,&local_a0);
      a = a + local_68;
      b = b + local_70;
      uVar8 = (int)local_60 + 4;
      uVar9 = (ulong)uVar8;
      puVar6 = puVar6 + local_70;
      puVar10 = puVar10 + local_68;
    } while ((int)uVar8 < height);
  }
  iVar5 = summary_all_avx2(&local_a0);
  return iVar5;
}

Assistant:

int64_t aom_sse_avx2(const uint8_t *a, int a_stride, const uint8_t *b,
                     int b_stride, int width, int height) {
  int32_t y = 0;
  int64_t sse = 0;
  __m256i sum = _mm256_setzero_si256();
  __m256i zero = _mm256_setzero_si256();
  switch (width) {
    case 4:
      do {
        sse_w4x4_avx2(a, a_stride, b, b_stride, &sum);
        a += a_stride << 2;
        b += b_stride << 2;
        y += 4;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 8:
      do {
        sse_w8x2_avx2(a, a_stride, b, b_stride, &sum);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 16:
      do {
        const __m128i v_a0 = xx_loadu_128(a);
        const __m128i v_a1 = xx_loadu_128(a + a_stride);
        const __m128i v_b0 = xx_loadu_128(b);
        const __m128i v_b1 = xx_loadu_128(b + b_stride);
        const __m256i v_a =
            _mm256_insertf128_si256(_mm256_castsi128_si256(v_a0), v_a1, 0x01);
        const __m256i v_b =
            _mm256_insertf128_si256(_mm256_castsi128_si256(v_b0), v_b1, 0x01);
        const __m256i v_al = _mm256_unpacklo_epi8(v_a, zero);
        const __m256i v_au = _mm256_unpackhi_epi8(v_a, zero);
        const __m256i v_bl = _mm256_unpacklo_epi8(v_b, zero);
        const __m256i v_bu = _mm256_unpackhi_epi8(v_b, zero);
        const __m256i v_asub = _mm256_sub_epi16(v_al, v_bl);
        const __m256i v_bsub = _mm256_sub_epi16(v_au, v_bu);
        const __m256i temp =
            _mm256_add_epi32(_mm256_madd_epi16(v_asub, v_asub),
                             _mm256_madd_epi16(v_bsub, v_bsub));
        sum = _mm256_add_epi32(sum, temp);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 32:
      do {
        sse_w32_avx2(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 64:
      do {
        sse_w32_avx2(&sum, a, b);
        sse_w32_avx2(&sum, a + 32, b + 32);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 128:
      do {
        sse_w32_avx2(&sum, a, b);
        sse_w32_avx2(&sum, a + 32, b + 32);
        sse_w32_avx2(&sum, a + 64, b + 64);
        sse_w32_avx2(&sum, a + 96, b + 96);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    default:
      if ((width & 0x07) == 0) {
        do {
          int i = 0;
          do {
            sse_w8x2_avx2(a + i, a_stride, b + i, b_stride, &sum);
            i += 8;
          } while (i < width);
          a += a_stride << 1;
          b += b_stride << 1;
          y += 2;
        } while (y < height);
      } else {
        do {
          int i = 0;
          do {
            sse_w8x2_avx2(a + i, a_stride, b + i, b_stride, &sum);
            const uint8_t *a2 = a + i + (a_stride << 1);
            const uint8_t *b2 = b + i + (b_stride << 1);
            sse_w8x2_avx2(a2, a_stride, b2, b_stride, &sum);
            i += 8;
          } while (i + 4 < width);
          sse_w4x4_avx2(a + i, a_stride, b + i, b_stride, &sum);
          a += a_stride << 2;
          b += b_stride << 2;
          y += 4;
        } while (y < height);
      }
      sse = summary_all_avx2(&sum);
      break;
  }

  return sse;
}